

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::sortArc(MyArc *arcs,int noArcs)

{
  undefined1 local_c8 [8];
  MyArc t;
  int j;
  int max;
  int i;
  int noArcs_local;
  MyArc *arcs_local;
  
  for (j = 0; j < noArcs + -1; j = j + 1) {
    t.ellipseFitError._4_4_ = j;
    t.ellipseFitError._0_4_ = j;
    while (t.ellipseFitError._0_4_ = t.ellipseFitError._0_4_ + 1, t.ellipseFitError._0_4_ < noArcs)
    {
      if (arcs[t.ellipseFitError._4_4_].coverRatio <= arcs[t.ellipseFitError._0_4_].coverRatio &&
          arcs[t.ellipseFitError._0_4_].coverRatio != arcs[t.ellipseFitError._4_4_].coverRatio) {
        t.ellipseFitError._4_4_ = t.ellipseFitError._0_4_;
      }
    }
    if (t.ellipseFitError._4_4_ != j) {
      memcpy(local_c8,arcs + j,0xa8);
      memcpy(arcs + j,arcs + t.ellipseFitError._4_4_,0xa8);
      memcpy(arcs + t.ellipseFitError._4_4_,local_c8,0xa8);
    }
  }
  return;
}

Assistant:

void EDCircles::sortArc(MyArc * arcs, int noArcs)
{
	for (int i = 0; i<noArcs - 1; i++) {
		int max = i;
		for (int j = i + 1; j<noArcs; j++) {
			if (arcs[j].coverRatio > arcs[max].coverRatio) max = j;
		} //end-for

		if (max != i) {
			MyArc t = arcs[i];
			arcs[i] = arcs[max];
			arcs[max] = t;
		} // end-if
	} //end-for
}